

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlOutputBufferWrite(xmlOutputBufferPtr out,int len,char *data)

{
  xmlOutputWriteCallback p_Var1;
  void *pvVar2;
  int iVar3;
  xmlBufPtr pxVar4;
  size_t sVar5;
  xmlChar *pxVar6;
  int local_68;
  int local_5c;
  size_t nbchars;
  ulong uStack_38;
  int ret;
  size_t written;
  xmlBufPtr buf;
  char *data_local;
  int len_local;
  xmlOutputBufferPtr out_local;
  
  written = 0;
  uStack_38 = 0;
  if ((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) {
    out_local._4_4_ = -1;
  }
  else if (len < 0) {
    out_local._4_4_ = 0;
  }
  else {
    iVar3 = xmlBufAdd(out->buffer,(xmlChar *)data,(long)len);
    if (iVar3 == 0) {
      if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        if (out->writecallback == (xmlOutputWriteCallback)0x0) {
          uStack_38 = (ulong)len;
        }
        else {
          written = (size_t)out->buffer;
        }
      }
      else {
        if (out->conv == (xmlBufPtr)0x0) {
          pxVar4 = xmlBufCreate(4000);
          out->conv = pxVar4;
          if (out->conv == (xmlBufPtr)0x0) {
            out->error = 2;
            return -1;
          }
        }
        sVar5 = xmlBufUse(out->buffer);
        if (sVar5 < 0x100) {
          nbchars._4_4_ = 0;
        }
        else {
          nbchars._4_4_ = xmlCharEncOutput(out,0);
          if (nbchars._4_4_ < 0) {
            return -1;
          }
        }
        if (out->writecallback == (xmlOutputWriteCallback)0x0) {
          uStack_38 = (ulong)nbchars._4_4_;
        }
        else {
          written = (size_t)out->conv;
        }
      }
      if ((written != 0) && (out->writecallback != (xmlOutputWriteCallback)0x0)) {
        while (sVar5 = xmlBufUse((xmlBufPtr)written), 3999 < sVar5) {
          p_Var1 = out->writecallback;
          pvVar2 = out->context;
          pxVar6 = xmlBufContent((xmlBuf *)written);
          local_5c = (*p_Var1)(pvVar2,(char *)pxVar6,(int)sVar5);
          if (local_5c < 0) {
            if (local_5c == -1) {
              local_5c = 0x60a;
            }
            else {
              local_5c = -local_5c;
            }
            out->error = local_5c;
            return -1;
          }
          if ((local_5c == 0) || (sVar5 < (ulong)(long)local_5c)) {
            out->error = 1;
            return -1;
          }
          xmlBufShrink((xmlBufPtr)written,(long)local_5c);
          uStack_38 = (long)local_5c + uStack_38;
          if (0x7fffffff - local_5c < out->written) {
            out->written = 0x7fffffff;
          }
          else {
            out->written = local_5c + out->written;
          }
        }
      }
      if (uStack_38 < 0x80000000) {
        local_68 = (int)uStack_38;
      }
      else {
        local_68 = 0x7fffffff;
      }
      out_local._4_4_ = local_68;
    }
    else {
      out->error = 2;
      out_local._4_4_ = -1;
    }
  }
  return out_local._4_4_;
}

Assistant:

int
xmlOutputBufferWrite(xmlOutputBufferPtr out, int len, const char *data) {
    xmlBufPtr buf = NULL;
    size_t written = 0;
    int ret;

    if ((out == NULL) || (out->error))
        return(-1);
    if (len < 0)
        return(0);

    ret = xmlBufAdd(out->buffer, (const xmlChar *) data, len);
    if (ret != 0) {
        out->error = XML_ERR_NO_MEMORY;
        return(-1);
    }

    /*
     * first handle encoding stuff.
     */
    if (out->encoder != NULL) {
        /*
         * Store the data in the incoming raw buffer
         */
        if (out->conv == NULL) {
            out->conv = xmlBufCreate(MINLEN);
            if (out->conv == NULL) {
                out->error = XML_ERR_NO_MEMORY;
                return(-1);
            }
        }

        /*
         * convert as much as possible to the parser reading buffer.
         */
        if (xmlBufUse(out->buffer) < 256) {
            ret = 0;
        } else {
            ret = xmlCharEncOutput(out, 0);
            if (ret < 0)
                return(-1);
        }

        if (out->writecallback)
            buf = out->conv;
        else
            written = ret;
    } else {
        if (out->writecallback)
            buf = out->buffer;
        else
            written = len;
    }

    if ((buf != NULL) && (out->writecallback)) {
        /*
         * second write the stuff to the I/O channel
         */
        while (1) {
            size_t nbchars = xmlBufUse(buf);

            if (nbchars < MINLEN)
                break;

            ret = out->writecallback(out->context,
                       (const char *)xmlBufContent(buf), nbchars);
            if (ret < 0) {
                out->error = (ret == -1) ? XML_IO_WRITE : -ret;
                return(-1);
            }
            if ((ret == 0) || ((size_t) ret > nbchars)) {
                out->error = XML_ERR_INTERNAL_ERROR;
                return(-1);
            }

            xmlBufShrink(buf, ret);
            written += ret;
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
        }
    }

    return(written <= INT_MAX ? written : INT_MAX);
}